

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringAtoIMethod::eval
          (StringAtoIMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  string_view str_00;
  undefined1 uVar1;
  int iVar2;
  string *this_00;
  _Optional_base<int,_true,_true> this_01;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  size_t *in_RSI;
  ConstantValue *in_RDI;
  int result;
  string str;
  ConstantValue cv;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  Expression *in_stack_ffffffffffffff08;
  undefined1 *puVar3;
  undefined7 in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 local_58 [88];
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  puVar3 = local_58;
  Expression::eval(in_stack_ffffffffffffff08,
                   (EvalContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  uVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x98dd81);
  if ((bool)uVar1) {
    this_00 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x98ddd7);
    std::__cxx11::string::string
              (in_stack_ffffffffffffff40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff38));
    std::erase<char,std::char_traits<char>,std::allocator<char>,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    str_00._M_str._0_7_ = in_stack_ffffffffffffff38;
    str_00._M_len = (size_t)puVar3;
    str_00._M_str._7_1_ = uVar1;
    this_01._M_payload.super__Optional_payload_base<int> =
         (_Optional_payload<int,_true,_true,_true>)
         strToInt(str_00,in_RSI,(int)((ulong)in_RDI >> 0x20));
    iVar2 = std::optional<int>::value_or<int>
                      ((optional<int> *)this_01._M_payload.super__Optional_payload_base<int>,
                       (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    SVInt::SVInt((SVInt *)this_00,this_01._M_payload.super__Optional_payload_base<int>._4_4_,
                 CONCAT44(iVar2,in_stack_ffffffffffffff00),(bool)in_stack_fffffffffffffeff);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(iVar2,in_stack_ffffffffffffff00),
               (SVInt *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    SVInt::~SVInt((SVInt *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff00));
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (nullptr_t)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x98df16);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto cv = args[0]->eval(context);
        if (!cv)
            return nullptr;

        std::string str = cv.str();
        std::erase(str, '_');

        int result = strToInt(str, nullptr, base).value_or(0);
        return SVInt(32, uint64_t(result), true);
    }